

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

void Prs_CreateOutConcat(Cba_Ntk_t *p,int *pSlices,int nSlices)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *p_00;
  int Top;
  int Bot;
  int Right;
  int Left;
  int iFon_1;
  int Range;
  int nBits;
  int Prev;
  int nParts;
  int iFon;
  int iObj;
  int k;
  int i;
  int TopId;
  int BotId;
  int RightId;
  int LeftId;
  int RangeId;
  int NameId;
  Vec_Int_t *vBits;
  int nSlices_local;
  int *pSlices_local;
  Cba_Ntk_t *p_local;
  
  p_00 = &p->vArray1;
  iVar6 = *pSlices;
  iVar1 = Cba_NtkGetMap(p,iVar6);
  iVar1 = -iVar1;
  iVar2 = Cba_NtkRangeLeft(p,iVar1);
  iVar3 = Cba_NtkRangeRight(p,iVar1);
  iVar4 = Abc_MinInt(iVar2,iVar3);
  iVar5 = Abc_MaxInt(iVar2,iVar3);
  if (iVar1 < 1) {
    __assert_fail("RangeId > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                  ,0x637,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
  }
  iVar1 = Abc_MaxInt(iVar2,iVar3);
  Vec_IntFill(p_00,iVar1 + 1,0);
  for (iObj = 0; iObj < nSlices; iObj = iObj + 1) {
    iVar1 = pSlices[iObj * 3 + 1];
    iVar2 = pSlices[iObj * 3 + 2];
    iVar3 = Cba_NtkRangeLeft(p,iVar1);
    iVar1 = Cba_NtkRangeRight(p,iVar1);
    iFon = Abc_MinInt(iVar3,iVar1);
    iVar1 = Abc_MaxInt(iVar3,iVar1);
    if ((iVar6 != pSlices[iObj * 3]) || (iVar2 < 1)) {
      __assert_fail("NameId == pSlices[3*i+0] && iFon > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                    ,0x642,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
    }
    if ((iFon < iVar4) || (iVar5 < iVar1)) {
      __assert_fail("BotId <= Bot && Top <= TopId",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                    ,0x643,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
    }
    for (; iFon <= iVar1; iFon = iFon + 1) {
      iVar3 = Vec_IntEntry(p_00,iFon);
      if (iVar3 != 0) {
        __assert_fail("Vec_IntEntry(vBits, k) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x646,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
      }
      Vec_IntWriteEntry(p_00,iFon,iVar2);
    }
  }
  Range = -1;
  nBits = 0;
  for (iObj = iVar4; iObj < iVar5 + 1; iObj = iObj + 1) {
    iVar1 = Vec_IntEntry(p_00,iObj);
    if (Range != iVar1) {
      nBits = nBits + 1;
    }
    Range = iVar1;
  }
  iVar1 = Cba_ObjAlloc(p,CBA_BOX_CONCAT,nBits,1);
  iVar2 = Cba_ObjFon0(p,iVar1);
  Cba_FonSetName(p,iVar2,iVar6);
  Prs_CreateRange(p,iVar2,iVar6);
  iFon = 0;
  Range = -1;
  iFon_1 = 0;
  for (iObj = iVar4; iObj < iVar5 + 1; iObj = iObj + 1) {
    iVar6 = Vec_IntEntry(p_00,iObj);
    if ((Range == -1) || (Range == iVar6)) {
      iFon_1 = iFon_1 + 1;
    }
    else {
      if (Range == 0) {
        Range = Cba_ManNewConstZero(p,iFon_1);
      }
      iVar2 = Cba_FonRangeSize(p,Range);
      if (iFon_1 != iVar2) {
        __assert_fail("nBits == Cba_FonRangeSize(p, Prev)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x661,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
      }
      Cba_ObjSetFinFon(p,iVar1,(nBits + -1) - iFon,Range);
      iFon_1 = 1;
      iFon = iFon + 1;
    }
    Range = iVar6;
  }
  iVar6 = Cba_FonRangeSize(p,Range);
  if (iFon_1 != iVar6) {
    __assert_fail("nBits == Cba_FonRangeSize(p, Prev)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                  ,0x667,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
  }
  Cba_ObjSetFinFon(p,iVar1,(nBits + -1) - iFon,Range);
  if (iFon + 1 == nBits) {
    return;
  }
  __assert_fail("k == nParts",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                ,0x669,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
}

Assistant:

void Prs_CreateOutConcat( Cba_Ntk_t * p, int * pSlices, int nSlices )
{
    Vec_Int_t * vBits = &p->vArray1;
    int NameId    = pSlices[0];
    int RangeId   = -Cba_NtkGetMap(p, NameId);
    int LeftId    = Cba_NtkRangeLeft( p, RangeId );
    int RightId   = Cba_NtkRangeRight( p, RangeId );
    int BotId     = Abc_MinInt( LeftId, RightId );
    int TopId     = Abc_MaxInt( LeftId, RightId );
    int i, k, iObj, iFon, nParts, Prev, nBits;
    assert( RangeId > 0 );
    Vec_IntFill( vBits, Abc_MaxInt(LeftId, RightId) + 1, 0 );
    // fill up with slices
    for ( i = 0; i < nSlices; i++ )
    {
        int Range = pSlices[3*i+1];
        int iFon  = pSlices[3*i+2];
        int Left  = Cba_NtkRangeLeft( p, Range );
        int Right = Cba_NtkRangeRight( p, Range );
        int Bot   = Abc_MinInt( Left, Right );
        int Top   = Abc_MaxInt( Left, Right );
        assert( NameId == pSlices[3*i+0] && iFon > 0 );
        assert( BotId <= Bot && Top <= TopId );
        for ( k = Bot; k <= Top; k++ )
        {
            assert( Vec_IntEntry(vBits, k) == 0 );
            Vec_IntWriteEntry( vBits, k, iFon );
        }
    }
    // check how many parts we have
    Prev = -1; nParts = 0; 
    Vec_IntForEachEntryStartStop( vBits, iFon, i, BotId, TopId+1 )
    {
        if ( Prev != iFon )
            nParts++;
        Prev = iFon;
    }
    // create new concatenation
    iObj = Cba_ObjAlloc( p, CBA_BOX_CONCAT, nParts, 1 );
    iFon = Cba_ObjFon0(p, iObj);
    Cba_FonSetName( p, iFon, NameId );
    Prs_CreateRange( p, iFon, NameId );
    // set inputs
    k = 0; Prev = -1; nBits = 0;
    Vec_IntForEachEntryStartStop( vBits, iFon, i, BotId, TopId+1 )
    {
        if ( Prev == -1 || Prev == iFon )
            nBits++;
        else
        {
            if ( Prev == 0 ) // create constant
                Prev = Cba_ManNewConstZero( p, nBits );
            assert( nBits == Cba_FonRangeSize(p, Prev) );
            Cba_ObjSetFinFon( p, iObj, nParts-1-k++, Prev );
            nBits = 1;
        }
        Prev = iFon;         
    }
    assert( nBits == Cba_FonRangeSize(p, Prev) );
    Cba_ObjSetFinFon( p, iObj, nParts-1-k++, Prev );
    assert( k == nParts );
}